

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

type __thiscall
cm::String::replace<char_const(&)[3]>
          (String *this,const_iterator first,const_iterator last,char (*s) [3])

{
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  const_iterator pvVar1;
  const_pointer pvVar2;
  type pSVar3;
  undefined1 local_58 [8];
  string out;
  string_view v;
  char (*s_local) [3];
  const_iterator last_local;
  const_iterator first_local;
  String *this_local;
  
  join_0x00000010_0x00000000_ = AsStringView<char[3]>::view(s);
  std::__cxx11::string::string((string *)local_58);
  std::basic_string_view<char,_std::char_traits<char>_>::begin(&this->view_);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&out.field_2 + 8));
  std::basic_string_view<char,_std::char_traits<char>_>::end(&this->view_);
  std::__cxx11::string::reserve((ulong)local_58);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::begin(&this->view_);
  std::__cxx11::string::append<char_const*,void>((string *)local_58,pvVar1,first);
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)((long)&out.field_2 + 8);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
  std::__cxx11::string::append(local_58,(ulong)pvVar2);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::end(&this->view_);
  std::__cxx11::string::append<char_const*,void>((string *)local_58,last,pvVar1);
  pSVar3 = operator=(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58);
  std::__cxx11::string::~string((string *)local_58);
  return pSVar3;
}

Assistant:

typename std::enable_if<AsStringView<T>::value, String&>::type replace(
    const_iterator first, const_iterator last, T&& s)
  {
    string_view v = AsStringView<T>::view(std::forward<T>(s));
    std::string out;
    out.reserve((first - view_.begin()) + v.size() + (view_.end() - last));
    out.append(view_.begin(), first);
    out.append(v.data(), v.size());
    out.append(last, view_.end());
    return *this = std::move(out);
  }